

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O1

int SUNMemoryHelper_Alloc
              (SUNMemoryHelper helper,SUNMemory *memptr,size_t memsize,SUNMemoryType mem_type,
              void *queue)

{
  _func_int_SUNMemoryHelper_SUNMemory_ptr_size_t_SUNMemoryType_void_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  UNRECOVERED_JUMPTABLE = helper->ops->alloc;
  if (UNRECOVERED_JUMPTABLE !=
      (_func_int_SUNMemoryHelper_SUNMemory_ptr_size_t_SUNMemoryType_void_ptr *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(helper,memptr,memsize,mem_type,queue);
    return iVar1;
  }
  return -1;
}

Assistant:

int SUNMemoryHelper_Alloc(SUNMemoryHelper helper, SUNMemory* memptr,
                          size_t memsize, SUNMemoryType mem_type, void* queue)
{
  int ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(helper));
  if (helper->ops->alloc == NULL)
    ier = -1;
  else
    ier = helper->ops->alloc(helper, memptr, memsize, mem_type, queue);
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(helper));
  return(ier);
}